

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O0

int menu_item_left_offset_internal(Am_Widget_Look *look,bool menuBarItem)

{
  Am_Widget_Look_vals AVar1;
  bool menuBarItem_local;
  Am_Widget_Look *look_local;
  
  AVar1 = look->value;
  if (AVar1 == Am_MOTIF_LOOK_val) {
    look_local._4_4_ = 0xf;
    if (menuBarItem) {
      look_local._4_4_ = 5;
    }
  }
  else if (AVar1 == Am_WINDOWS_LOOK_val) {
    look_local._4_4_ = 0x16;
    if (menuBarItem) {
      look_local._4_4_ = 6;
    }
  }
  else {
    if (AVar1 != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    look_local._4_4_ = 0xf;
    if (menuBarItem) {
      look_local._4_4_ = 0xb;
    }
  }
  return look_local._4_4_;
}

Assistant:

int
menu_item_left_offset_internal(Am_Widget_Look &look, bool menuBarItem)
{
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return menuBarItem ? 5 : 15; //formerly 5

  case Am_WINDOWS_LOOK_val:
    return menuBarItem ? 6 : 22;

  case Am_MACINTOSH_LOOK_val:
    return menuBarItem ? 11 : 15;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 2; // we should never get here
}